

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::tryToOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this,Expression *oneSide
          ,Expression *otherSide)

{
  Load *pLVar1;
  ulong uVar2;
  Literal local_38;
  
  if (oneSide->_id == ConstId) {
    Literal::Literal(&local_38,(Literal *)(oneSide + 1));
    uVar2 = Literal::getInteger(&local_38);
    if ((uVar2 < 0x400) && (uVar2 = uVar2 + (this->curr->offset).addr, uVar2 < 0x400)) {
      Literal::~Literal(&local_38);
      pLVar1 = this->curr;
      (pLVar1->offset).addr = uVar2;
      pLVar1->ptr = otherSide;
      if (otherSide->_id != ConstId) {
        return true;
      }
      optimizeConstantPointer(this);
      return true;
    }
    Literal::~Literal(&local_38);
  }
  return false;
}

Assistant:

bool tryToOptimizeConstant(Expression* oneSide, Expression* otherSide) {
    if (auto* c = oneSide->dynCast<Const>()) {
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        curr->offset = result.total;
        curr->ptr = otherSide;
        if (curr->ptr->template is<Const>()) {
          optimizeConstantPointer();
        }
        return true;
      }
    }
    return false;
  }